

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O0

void __thiscall Sandbox::onMouseDrag(Sandbox *this,float _x,float _y,int _button)

{
  Camera *pCVar1;
  int iVar2;
  vec<2,_float,_(glm::qualifier)0> *in_RCX;
  float fVar3;
  float fVar4;
  float extraout_XMM0_Da;
  double dVar5;
  undefined8 local_c0;
  vec<3,_float,_(glm::qualifier)0> local_b4;
  vec<3,_float,_(glm::qualifier)0> local_a8;
  float local_9c;
  undefined8 uStack_98;
  float dist_1;
  undefined4 local_90;
  undefined8 local_84;
  undefined4 local_7c;
  vec<3,_float,_(glm::qualifier)0> local_78;
  vec<3,_float,_(glm::qualifier)0> local_6c;
  float local_60;
  float local_5c;
  float vel_y;
  float vel_x;
  float dist;
  mat<3,_3,_float,_(glm::qualifier)0> local_4c;
  float local_28;
  float local_24;
  float pd;
  float y;
  float x;
  int _button_local;
  float _y_local;
  float _x_local;
  Sandbox *this_local;
  
  if ((this->uniforms).super_Scene.activeCamera != (Camera *)0x0) {
    y = (float)_button;
    x = _y;
    _button_local = (int)_x;
    __y_local = this;
    if (this->quilt_resolution < 0) {
      local_24 = _y;
      pd = _x;
      local_28 = vera::getPixelDensity(false);
      fVar3 = pd;
      if (0.0 < pd) {
        iVar2 = vera::getWindowWidth();
        if ((float)iVar2 <= fVar3) {
          pd = 2.0;
        }
      }
      else {
        iVar2 = vera::getWindowWidth();
        pd = (float)(iVar2 + -2);
      }
      fVar3 = local_24;
      if (0.0 < local_24) {
        iVar2 = vera::getWindowHeight();
        if ((float)iVar2 <= fVar3) {
          local_24 = 2.0;
        }
      }
      else {
        iVar2 = vera::getWindowHeight();
        local_24 = (float)(iVar2 + -2);
      }
      if ((((pd != (float)_button_local) || (NAN(pd) || NAN((float)_button_local))) ||
          (local_24 != x)) || (NAN(local_24) || NAN(x))) {
        vera::setMousePosition(pd,local_24);
      }
    }
    if (y == 1.4013e-45) {
      fVar3 = vera::getMouseVelX();
      fVar4 = vera::getMouseVelY();
      glm::vec<2,_float,_(glm::qualifier)0>::vec
                ((vec<2,_float,_(glm::qualifier)0> *)&vel_x,-fVar3,-fVar4);
      glm::translate<float,(glm::qualifier)0>
                (&local_4c,(glm *)&this->m_view2d,(mat<3,_3,_float,_(glm::qualifier)0> *)&vel_x,
                 in_RCX);
      memcpy(&this->m_view2d,&local_4c,0x24);
      (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4f])();
      local_5c = vera::getMouseVelX();
      local_60 = vera::getMouseVelY();
      dVar5 = std::fabs((double)(ulong)(uint)local_5c);
      if ((SUB84(dVar5,0) < 50.0) &&
         (dVar5 = std::fabs((double)(ulong)(uint)local_60), SUB84(dVar5,0) < 50.0)) {
        this->m_camera_azimuth = this->m_camera_azimuth - local_5c;
        this->m_camera_elevation = this->m_camera_elevation + local_60 * -0.5;
        pCVar1 = (this->uniforms).super_Scene.activeCamera;
        glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_6c,0.0);
        (*(pCVar1->super_Node)._vptr_Node[0x29])(pCVar1,&local_6c);
        pCVar1 = (this->uniforms).super_Scene.activeCamera;
        glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_78,0.0);
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&local_84,0.0,1.0,0.0);
        local_90 = local_7c;
        uStack_98 = local_84;
        (*(pCVar1->super_Node)._vptr_Node[0x30])(local_84,pCVar1,&local_78);
      }
    }
    else {
      (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4f])();
      local_9c = extraout_XMM0_Da;
      fVar3 = vera::getMouseVelY();
      local_9c = fVar3 * -0.008 + local_9c;
      if (0.0 < local_9c) {
        pCVar1 = (this->uniforms).super_Scene.activeCamera;
        glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_a8,0.0);
        (*(pCVar1->super_Node)._vptr_Node[0x29])(pCVar1,&local_a8);
        pCVar1 = (this->uniforms).super_Scene.activeCamera;
        glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_b4,0.0);
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&local_c0,0.0,1.0,0.0);
        (*(pCVar1->super_Node)._vptr_Node[0x30])(local_c0,pCVar1,&local_b4);
      }
    }
  }
  return;
}

Assistant:

void Sandbox::onMouseDrag(float _x, float _y, int _button) {
    if (uniforms.activeCamera == nullptr)
        return;

    if (quilt_resolution < 0) {
        // If it's not playing on the HOLOPLAY
        // produce continue draging like blender
        //
        float x = _x;
        float y = _y;
        float pd = vera::getPixelDensity();

        if (x <= 0) x = vera::getWindowWidth() - 2;
        else if (x >= vera::getWindowWidth()) x = 2; 

        if (y <= 0) y = vera::getWindowHeight() - 2;
        else if (y >= vera::getWindowHeight()) y = 2;

        if (x != _x || y != _y) vera::setMousePosition(x, y);
    }

    if (_button == 1) {
        // Left-button drag is used to pan u_view2d.
        m_view2d = glm::translate(m_view2d, glm::vec2(-vera::getMouseVelX(),-vera::getMouseVelY()) );

        // Left-button drag is used to rotate geometry.
        float dist = uniforms.activeCamera->getDistance();

        float vel_x = vera::getMouseVelX();
        float vel_y = vera::getMouseVelY();

        if (fabs(vel_x) < 50.0 && fabs(vel_y) < 50.0) {
            m_camera_azimuth -= vel_x;
            m_camera_elevation -= vel_y * 0.5;
            uniforms.activeCamera->orbit(m_camera_azimuth, m_camera_elevation, dist);
            uniforms.activeCamera->lookAt(glm::vec3(0.0));
        }
    } 
    else {
        // Right-button drag is used to zoom geometry.
        float dist = uniforms.activeCamera->getDistance();
        dist += (-.008f * vera::getMouseVelY());
        if (dist > 0.0f) {
            uniforms.activeCamera->orbit(m_camera_azimuth, m_camera_elevation, dist);
            uniforms.activeCamera->lookAt(glm::vec3(0.0));
        }
    }
}